

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O0

VP8StatusCode DecodeWebPHeaders(WebPIDecoder *idec)

{
  VP8StatusCode VVar1;
  WebPIDecoder *idec_00;
  VP8Decoder *consumed_bytes;
  VP8LDecoder *pVVar2;
  long in_RDI;
  VP8LDecoder *dec_1;
  VP8Decoder *dec;
  WebPHeaderStructure headers;
  VP8StatusCode status;
  size_t curr_size;
  uint8_t *data;
  MemBuffer_conflict *mem;
  undefined8 in_stack_ffffffffffffff78;
  WebPIDecoder *in_stack_ffffffffffffff80;
  DecState new_state;
  uint8_t *local_58;
  size_t local_50;
  undefined8 local_48;
  undefined4 local_38;
  VP8StatusCode local_4;
  
  new_state = (DecState)((ulong)(*(long *)(in_RDI + 0x148) + *(long *)(in_RDI + 0x130)) >> 0x20);
  idec_00 = (WebPIDecoder *)MemDataSize((MemBuffer_conflict *)(in_RDI + 0x128));
  VVar1 = WebPParseHeaders((WebPHeaderStructure *)idec_00);
  if (VVar1 == VP8_STATUS_NOT_ENOUGH_DATA) {
    local_4 = VP8_STATUS_SUSPENDED;
  }
  else if (VVar1 == VP8_STATUS_OK) {
    *(undefined8 *)(in_RDI + 0x1e0) = local_48;
    *(undefined4 *)(in_RDI + 0x78) = local_38;
    if (*(int *)(in_RDI + 0x78) == 0) {
      consumed_bytes = VP8New();
      if (consumed_bytes == (VP8Decoder *)0x0) {
        return VP8_STATUS_OUT_OF_MEMORY;
      }
      *(VP8Decoder **)(in_RDI + 0x80) = consumed_bytes;
      consumed_bytes->alpha_data_ = local_58;
      consumed_bytes->alpha_data_size_ = local_50;
      ChangeState(idec_00,new_state,(size_t)consumed_bytes);
    }
    else {
      pVVar2 = VP8LNew();
      if (pVVar2 == (VP8LDecoder *)0x0) {
        return VP8_STATUS_OUT_OF_MEMORY;
      }
      *(VP8LDecoder **)(in_RDI + 0x80) = pVVar2;
      ChangeState(idec_00,new_state,(size_t)in_stack_ffffffffffffff80);
    }
    local_4 = VP8_STATUS_OK;
  }
  else {
    local_4 = IDecError(in_stack_ffffffffffffff80,
                        (VP8StatusCode)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  }
  return local_4;
}

Assistant:

static VP8StatusCode DecodeWebPHeaders(WebPIDecoder* const idec) {
  MemBuffer* const mem = &idec->mem_;
  const uint8_t* data = mem->buf_ + mem->start_;
  size_t curr_size = MemDataSize(mem);
  VP8StatusCode status;
  WebPHeaderStructure headers;

  headers.data = data;
  headers.data_size = curr_size;
  headers.have_all_data = 0;
  status = WebPParseHeaders(&headers);
  if (status == VP8_STATUS_NOT_ENOUGH_DATA) {
    return VP8_STATUS_SUSPENDED;  // We haven't found a VP8 chunk yet.
  } else if (status != VP8_STATUS_OK) {
    return IDecError(idec, status);
  }

  idec->chunk_size_ = headers.compressed_size;
  idec->is_lossless_ = headers.is_lossless;
  if (!idec->is_lossless_) {
    VP8Decoder* const dec = VP8New();
    if (dec == NULL) {
      return VP8_STATUS_OUT_OF_MEMORY;
    }
    idec->dec_ = dec;
    dec->alpha_data_ = headers.alpha_data;
    dec->alpha_data_size_ = headers.alpha_data_size;
    ChangeState(idec, STATE_VP8_HEADER, headers.offset);
  } else {
    VP8LDecoder* const dec = VP8LNew();
    if (dec == NULL) {
      return VP8_STATUS_OUT_OF_MEMORY;
    }
    idec->dec_ = dec;
    ChangeState(idec, STATE_VP8L_HEADER, headers.offset);
  }
  return VP8_STATUS_OK;
}